

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

bool __thiscall ArgsManager::SoftSetBoolArg(ArgsManager *this,string *strArg,bool fValue)

{
  byte bVar1;
  byte in_DL;
  string *in_RSI;
  ArgsManager *in_RDI;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *strArg_00;
  allocator<char> *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  undefined7 in_stack_ffffffffffffff98;
  bool local_4b;
  allocator<char> local_4a;
  string local_49 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = in_DL & 1;
  if (bVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    local_4b = SoftSetArg(in_RDI,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    std::__cxx11::string::~string(in_stack_ffffffffffffff48);
    std::allocator<char>::~allocator(&local_4a);
  }
  else {
    strArg_00 = local_49;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(bVar1,in_stack_ffffffffffffff98),in_stack_ffffffffffffff90,
               in_stack_ffffffffffffff88);
    local_4b = SoftSetArg(in_RDI,strArg_00,in_RSI);
    std::__cxx11::string::~string(in_stack_ffffffffffffff48);
    std::allocator<char>::~allocator((allocator<char> *)local_49);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_4b;
  }
  __stack_chk_fail();
}

Assistant:

bool ArgsManager::SoftSetBoolArg(const std::string& strArg, bool fValue)
{
    if (fValue)
        return SoftSetArg(strArg, std::string("1"));
    else
        return SoftSetArg(strArg, std::string("0"));
}